

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_page.cpp
# Opt level: O2

bool __thiscall http::Page::SendFile(Page *this,char *filename)

{
  FILE *__stream;
  ostream *poVar1;
  size_t sVar2;
  uchar buffer [512];
  char s [512];
  
  __stream = fopen(filename,"rb");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    ftell(__stream);
    fseek(__stream,0,0);
    std::operator<<(&this->m_ostream,"HTTP/1.0 200 OK\r\nContent-Type: application/java-archive\r\n"
                   );
    poVar1 = std::operator<<(&this->m_ostream,"Content-Length: ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,"\r\n\r\n");
    SendString(this,s);
    while( true ) {
      sVar2 = fread(buffer,1,0x200,__stream);
      if ((int)(uint)sVar2 < 1) break;
      RawSend(this,buffer,(ulong)((uint)sVar2 & 0x7fffffff));
    }
  }
  return __stream != (FILE *)0x0;
}

Assistant:

bool http::Page::SendFile(const char* filename)
{
    char s[BUFFER_SIZE];
    FILE* f;
    bool rc = false;
    unsigned char buffer[512];
    uint64_t counti64;
    int count;
    std::ostream& out = get_output_stream();

    f = fopen(filename, "rb");
    if (f)
    {
#ifdef _WIN32
        _fseeki64(f, 0, SEEK_END);
        counti64 = _ftelli64(f);
        _fseeki64(f, 0, SEEK_SET);
#elif __linux__
        fseek(f, 0, SEEK_END);
        counti64 = ftell(f);
        fseek(f, 0, SEEK_SET);
#endif
        out << "HTTP/1.0 200 OK\r\nContent-Type: application/java-archive\r\n";
        out << "Content-Length: " << counti64 << "\r\n\r\n";
        SendString(s);

        do
        {
            count = (int)fread(buffer, 1, sizeof(buffer), f);
            if (count > 0)
            {
                RawSend(buffer, count);
            }
        } while (count > 0);

        rc = true;
    }

    return rc;
}